

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O0

void ncnn::conv_im2col_sgemm_int8_dequant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,int kernel_w,int kernel_h,int stride_w,
               int stride_h,Mat *_bias,vector<float,_std::allocator<float>_> *scale_dequant,
               Option *opt)

{
  char *pcVar1;
  reference pvVar2;
  float *pfVar3;
  int in_ECX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  Mat *in_stack_00000010;
  vector<float,_std::allocator<float>_> *in_stack_00000018;
  int k_3;
  char *va_3;
  char *vb_3;
  int sum_1;
  int n_5;
  int n_4;
  int n_3;
  int k_2;
  int sum [4];
  char *va_2;
  char *vb_2;
  int j_2;
  float scale_dequant0_1;
  float bias0_1;
  float *output;
  int i_4;
  int k_1;
  char *va_1;
  char *vb_1;
  int sum3_1;
  int sum2_1;
  int sum1_1;
  int sum0_1;
  int n_2;
  int n_1;
  int n;
  int k;
  int sum3 [4];
  int sum2 [4];
  int sum1 [4];
  int sum0 [4];
  char *va;
  char *vb;
  int j_1;
  float *output3;
  float *output2;
  float *output1;
  float *output0;
  float scale_dequant3;
  float scale_dequant2;
  float scale_dequant1;
  float scale_dequant0;
  float bias3;
  float bias2;
  float bias1;
  float bias0;
  int i_3;
  int pp_1;
  int remain_outch_start_1;
  int nn_outch_1;
  int q_3;
  char *ktmp_1;
  char *k0_1;
  int p_2;
  int q_2;
  char *ktmp;
  char *k3;
  char *k2;
  char *k1;
  char *k0;
  int p_1;
  int pp;
  int remain_outch_start;
  int nn_outch;
  Mat kernel_tm;
  int q_1;
  char *tmpptr_1;
  char *img0_1;
  int i_2;
  int q;
  char *tmpptr;
  char *img3;
  char *img2;
  char *img1;
  char *img0;
  int i_1;
  int ii;
  int remain_size_start;
  int nn_size;
  Mat bottom_tm;
  int K;
  int N;
  int out_size;
  int kernel_size;
  int index;
  int col;
  int row;
  int v;
  int u;
  char *input;
  int p;
  int j;
  int i;
  int retID;
  char *ret;
  Mat bottom_im2row;
  float *bias;
  char *kernel;
  int outch;
  int outh;
  int outw;
  int inch;
  int w;
  Allocator *in_stack_fffffffffffff748;
  char *in_stack_fffffffffffff750;
  int _c;
  Mat *in_stack_fffffffffffff758;
  Mat *in_stack_fffffffffffff760;
  float local_87c;
  float local_820;
  float local_81c;
  float local_818;
  float local_814;
  int local_7d4;
  Mat local_7d0;
  char *local_790;
  Mat local_788;
  char *local_748;
  int local_73c;
  int local_738;
  int local_734;
  int local_730;
  int local_72c;
  int local_728 [4];
  Mat local_718;
  char *local_6d8;
  Mat local_6d0;
  char *local_690;
  int local_684;
  value_type local_680;
  float local_67c;
  Mat local_678;
  float *local_638;
  int local_630;
  int local_62c;
  Mat local_628;
  char *local_5e8;
  Mat local_5e0;
  char *local_5a0;
  int local_598;
  int local_594;
  int local_590;
  int local_58c;
  int local_588;
  int local_584;
  int local_580;
  int local_57c;
  int local_578 [4];
  int local_568 [4];
  int local_558 [4];
  int local_548 [6];
  Mat local_530;
  char *local_4f0;
  Mat local_4e8;
  char *local_4a8;
  int local_49c;
  Mat local_498;
  float *local_458;
  Mat local_450;
  float *local_410;
  Mat local_408;
  float *local_3c8;
  Mat local_3c0;
  float *local_380;
  value_type local_374;
  value_type local_370;
  value_type local_36c;
  value_type local_368;
  float local_364;
  float local_360;
  float local_35c;
  float local_358;
  int local_354;
  int local_350;
  int local_34c;
  int local_348;
  int local_344;
  Mat local_340;
  char *local_300;
  char *local_2f8;
  int local_2f0;
  int local_2ec;
  Mat local_2e8;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  int local_280;
  int local_27c;
  int local_278;
  int local_274;
  int local_22c;
  Mat local_228;
  char *local_1e8;
  char *local_1e0;
  int local_1d8;
  int local_1d4;
  Mat local_1d0;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  Mat local_e8;
  char *local_a8;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  char *local_90;
  Mat local_88;
  float *local_48;
  char *local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_28 = *(int *)(in_RDI + 0x2c);
  local_2c = *(int *)(in_RDI + 0x34);
  local_30 = *(int *)(in_RSI + 0x2c);
  local_34 = *(int *)(in_RSI + 0x30);
  local_38 = *(int *)(in_RSI + 0x34);
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_40 = Mat::operator_cast_to_signed_char_(in_RDX);
  local_48 = Mat::operator_cast_to_float_(in_stack_00000010);
  Mat::Mat(in_stack_fffffffffffff760,(int)((ulong)in_stack_fffffffffffff758 >> 0x20),
           (int)in_stack_fffffffffffff758,(size_t)in_stack_fffffffffffff750,
           in_stack_fffffffffffff748);
  local_90 = Mat::operator_cast_to_signed_char_(&local_88);
  local_94 = 0;
  for (local_98 = 0; local_98 < local_34; local_98 = local_98 + 1) {
    for (local_9c = 0; local_9c < local_30; local_9c = local_9c + 1) {
      for (local_a0 = 0; local_a0 < local_2c; local_a0 = local_a0 + 1) {
        Mat::channel(in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
        pcVar1 = Mat::operator_cast_to_signed_char_(&local_e8);
        Mat::~Mat((Mat *)0x1577d2);
        for (local_f8 = 0; local_f8 < local_20; local_f8 = local_f8 + 1) {
          for (local_fc = 0; local_fc < local_1c; local_fc = local_fc + 1) {
            local_100 = local_f8 + local_98 * in_stack_00000008;
            local_104 = local_fc + local_9c * local_24;
            local_108 = local_100 * local_28 + local_104;
            local_90[local_94] = pcVar1[local_108];
            local_94 = local_94 + 1;
          }
        }
        local_a8 = pcVar1;
      }
    }
  }
  local_10c = local_1c * local_20;
  local_110 = local_30 * local_34;
  local_114 = local_30 * local_34;
  local_118 = local_1c * local_20 * local_2c;
  Mat::Mat(in_stack_fffffffffffff760,(int)((ulong)in_stack_fffffffffffff758 >> 0x20),
           (int)in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20),
           (size_t)in_stack_fffffffffffff748,(Allocator *)0x1579fa);
  local_15c = local_110 >> 2;
  local_160 = local_15c << 2;
  for (local_164 = 0; local_164 < local_15c; local_164 = local_164 + 1) {
    local_168 = local_164 << 2;
    local_170 = Mat::row<signed_char>(&local_88,local_168);
    local_178 = Mat::row<signed_char>(&local_88,local_168 + 1);
    local_180 = Mat::row<signed_char>(&local_88,local_168 + 2);
    local_188 = Mat::row<signed_char>(&local_88,local_168 + 3);
    Mat::channel(in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
    pcVar1 = Mat::operator_cast_to_signed_char_(&local_1d0);
    Mat::~Mat((Mat *)0x157b1b);
    local_190 = pcVar1;
    for (local_1d4 = 0; local_1d4 + 1 < local_2c * local_10c; local_1d4 = local_1d4 + 2) {
      *local_190 = *local_170;
      local_190[1] = local_170[1];
      local_190[2] = *local_178;
      local_190[3] = local_178[1];
      local_190[4] = *local_180;
      local_190[5] = local_180[1];
      local_190[6] = *local_188;
      local_190[7] = local_188[1];
      local_190 = local_190 + 8;
      local_170 = local_170 + 2;
      local_178 = local_178 + 2;
      local_180 = local_180 + 2;
      local_188 = local_188 + 2;
    }
    for (; local_1d4 < local_2c * local_10c; local_1d4 = local_1d4 + 1) {
      *local_190 = *local_170;
      local_190[1] = *local_178;
      local_190[2] = *local_180;
      local_190[3] = *local_188;
      local_190 = local_190 + 4;
      local_170 = local_170 + 1;
      local_178 = local_178 + 1;
      local_180 = local_180 + 1;
      local_188 = local_188 + 1;
    }
  }
  for (local_1d8 = local_160; local_1d8 < local_110; local_1d8 = local_1d8 + 1) {
    local_1e0 = Mat::row<signed_char>(&local_88,local_1d8);
    Mat::channel(in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
    pcVar1 = Mat::operator_cast_to_signed_char_(&local_228);
    Mat::~Mat((Mat *)0x157e30);
    local_1e8 = pcVar1;
    for (local_22c = 0; local_22c + 1 < local_2c * local_10c; local_22c = local_22c + 2) {
      *local_1e8 = *local_1e0;
      local_1e8[1] = local_1e0[1];
      local_1e8 = local_1e8 + 2;
      local_1e0 = local_1e0 + 2;
    }
    for (; local_22c < local_2c * local_10c; local_22c = local_22c + 1) {
      *local_1e8 = *local_1e0;
      local_1e8 = local_1e8 + 1;
      local_1e0 = local_1e0 + 1;
    }
  }
  Mat::Mat(in_stack_fffffffffffff760,(int)((ulong)in_stack_fffffffffffff758 >> 0x20),
           (int)in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20),
           (size_t)in_stack_fffffffffffff748,(Allocator *)0x157fa2);
  local_274 = local_38 >> 2;
  local_278 = local_274 << 2;
  for (local_27c = 0; local_27c < local_274; local_27c = local_27c + 1) {
    local_280 = local_27c * 4;
    local_288 = local_40 + local_280 * local_2c * local_10c;
    local_290 = local_40 + (local_280 + 1) * local_2c * local_10c;
    local_298 = local_40 + (local_280 + 2) * local_2c * local_10c;
    local_2a0 = local_40 + (local_280 + 3) * local_2c * local_10c;
    Mat::channel(in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
    pcVar1 = Mat::operator_cast_to_signed_char_(&local_2e8);
    Mat::~Mat((Mat *)0x158125);
    local_2a8 = pcVar1;
    for (local_2ec = 0; local_2ec + 1 < local_2c * local_10c; local_2ec = local_2ec + 2) {
      *local_2a8 = *local_288;
      local_2a8[1] = local_288[1];
      local_2a8[2] = *local_290;
      local_2a8[3] = local_290[1];
      local_2a8[4] = *local_298;
      local_2a8[5] = local_298[1];
      local_2a8[6] = *local_2a0;
      local_2a8[7] = local_2a0[1];
      local_2a8 = local_2a8 + 8;
      local_288 = local_288 + 2;
      local_290 = local_290 + 2;
      local_298 = local_298 + 2;
      local_2a0 = local_2a0 + 2;
    }
    for (; local_2ec < local_2c * local_10c; local_2ec = local_2ec + 1) {
      *local_2a8 = *local_288;
      local_2a8[1] = *local_290;
      local_2a8[2] = *local_298;
      local_2a8[3] = *local_2a0;
      local_2a8 = local_2a8 + 4;
      local_288 = local_288 + 1;
      local_290 = local_290 + 1;
      local_298 = local_298 + 1;
      local_2a0 = local_2a0 + 1;
    }
  }
  for (local_2f0 = local_278; local_2f0 < local_38; local_2f0 = local_2f0 + 1) {
    local_2f8 = local_40 + local_2f0 * local_2c * local_10c;
    Mat::channel(in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
    pcVar1 = Mat::operator_cast_to_signed_char_(&local_340);
    Mat::~Mat((Mat *)0x15844f);
    local_300 = pcVar1;
    for (local_344 = 0; local_344 + 1 < local_2c * local_10c; local_344 = local_344 + 2) {
      *local_300 = *local_2f8;
      local_300[1] = local_2f8[1];
      local_300 = local_300 + 2;
      local_2f8 = local_2f8 + 2;
    }
    for (; local_344 < local_2c * local_10c; local_344 = local_344 + 1) {
      *local_300 = *local_2f8;
      local_300 = local_300 + 1;
      local_2f8 = local_2f8 + 1;
    }
  }
  local_348 = local_38 >> 2;
  local_34c = local_348 << 2;
  for (local_350 = 0; local_350 < local_348; local_350 = local_350 + 1) {
    local_354 = local_350 * 4;
    if (local_48 == (float *)0x0) {
      local_814 = 0.0;
    }
    else {
      local_814 = local_48[local_354];
    }
    local_358 = local_814;
    if (local_48 == (float *)0x0) {
      local_818 = 0.0;
    }
    else {
      local_818 = local_48[local_354 + 1];
    }
    local_35c = local_818;
    if (local_48 == (float *)0x0) {
      local_81c = 0.0;
    }
    else {
      local_81c = local_48[local_354 + 2];
    }
    local_360 = local_81c;
    if (local_48 == (float *)0x0) {
      local_820 = 0.0;
    }
    else {
      local_820 = local_48[local_354 + 3];
    }
    local_364 = local_820;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)local_354);
    local_368 = *pvVar2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)(local_354 + 1));
    local_36c = *pvVar2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)(local_354 + 2));
    local_370 = *pvVar2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)(local_354 + 3));
    local_374 = *pvVar2;
    Mat::channel(in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
    pfVar3 = Mat::operator_cast_to_float_(&local_3c0);
    Mat::~Mat((Mat *)0x1587ed);
    local_380 = pfVar3;
    Mat::channel(in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
    pfVar3 = Mat::operator_cast_to_float_(&local_408);
    Mat::~Mat((Mat *)0x158841);
    local_3c8 = pfVar3;
    Mat::channel(in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
    pfVar3 = Mat::operator_cast_to_float_(&local_450);
    Mat::~Mat((Mat *)0x158896);
    local_410 = pfVar3;
    Mat::channel(in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
    pfVar3 = Mat::operator_cast_to_float_(&local_498);
    Mat::~Mat((Mat *)0x1588e8);
    local_458 = pfVar3;
    for (local_49c = 0; local_49c + 3 < local_114; local_49c = local_49c + 4) {
      Mat::channel(in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
      pcVar1 = Mat::operator_cast_to_signed_char_(&local_4e8);
      Mat::~Mat((Mat *)0x158963);
      local_4a8 = pcVar1;
      Mat::channel(in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
      pcVar1 = Mat::operator_cast_to_signed_char_(&local_530);
      Mat::~Mat((Mat *)0x1589ba);
      local_4f0 = pcVar1;
      memset(local_548,0,0x10);
      memset(local_558,0,0x10);
      memset(local_568,0,0x10);
      memset(local_578,0,0x10);
      for (local_57c = 0; local_57c + 1 < local_118; local_57c = local_57c + 2) {
        for (local_580 = 0; local_580 < 4; local_580 = local_580 + 1) {
          local_548[local_580] =
               (int)*local_4f0 * (int)local_4a8[local_580 << 1] + local_548[local_580];
          local_548[local_580] =
               (int)local_4f0[1] * (int)local_4a8[local_580 * 2 + 1] + local_548[local_580];
          local_558[local_580] =
               (int)local_4f0[2] * (int)local_4a8[local_580 << 1] + local_558[local_580];
          local_558[local_580] =
               (int)local_4f0[3] * (int)local_4a8[local_580 * 2 + 1] + local_558[local_580];
          local_568[local_580] =
               (int)local_4f0[4] * (int)local_4a8[local_580 << 1] + local_568[local_580];
          local_568[local_580] =
               (int)local_4f0[5] * (int)local_4a8[local_580 * 2 + 1] + local_568[local_580];
          local_578[local_580] =
               (int)local_4f0[6] * (int)local_4a8[local_580 << 1] + local_578[local_580];
          local_578[local_580] =
               (int)local_4f0[7] * (int)local_4a8[local_580 * 2 + 1] + local_578[local_580];
        }
        local_4f0 = local_4f0 + 8;
        local_4a8 = local_4a8 + 8;
      }
      for (; local_57c < local_118; local_57c = local_57c + 1) {
        for (local_584 = 0; local_584 < 4; local_584 = local_584 + 1) {
          local_548[local_584] = (int)*local_4f0 * (int)local_4a8[local_584] + local_548[local_584];
          local_558[local_584] =
               (int)local_4f0[1] * (int)local_4a8[local_584] + local_558[local_584];
          local_568[local_584] =
               (int)local_4f0[2] * (int)local_4a8[local_584] + local_568[local_584];
          local_578[local_584] =
               (int)local_4f0[3] * (int)local_4a8[local_584] + local_578[local_584];
        }
        local_4f0 = local_4f0 + 4;
        local_4a8 = local_4a8 + 4;
      }
      for (local_588 = 0; local_588 < 4; local_588 = local_588 + 1) {
        local_380[local_588] = (float)local_548[local_588] * local_368 + local_358;
        local_3c8[local_588] = (float)local_558[local_588] * local_36c + local_35c;
        local_410[local_588] = (float)local_568[local_588] * local_370 + local_360;
        local_458[local_588] = (float)local_578[local_588] * local_374 + local_364;
      }
      local_380 = local_380 + 4;
      local_3c8 = local_3c8 + 4;
      local_410 = local_410 + 4;
      local_458 = local_458 + 4;
    }
    for (; local_49c < local_114; local_49c = local_49c + 1) {
      local_58c = 0;
      local_590 = 0;
      local_594 = 0;
      local_598 = 0;
      Mat::channel(in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
      pcVar1 = Mat::operator_cast_to_signed_char_(&local_5e0);
      Mat::~Mat((Mat *)0x1590a5);
      local_5a0 = pcVar1;
      Mat::channel(in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
      pcVar1 = Mat::operator_cast_to_signed_char_(&local_628);
      Mat::~Mat((Mat *)0x1590fc);
      local_5e8 = pcVar1;
      for (local_62c = 0; local_62c + 1 < local_118; local_62c = local_62c + 2) {
        local_58c = (int)local_5e8[1] * (int)local_5a0[1] +
                    (int)*local_5e8 * (int)*local_5a0 + local_58c;
        local_590 = (int)local_5e8[3] * (int)local_5a0[1] +
                    (int)local_5e8[2] * (int)*local_5a0 + local_590;
        local_594 = (int)local_5e8[5] * (int)local_5a0[1] +
                    (int)local_5e8[4] * (int)*local_5a0 + local_594;
        local_598 = (int)local_5e8[7] * (int)local_5a0[1] +
                    (int)local_5e8[6] * (int)*local_5a0 + local_598;
        local_5e8 = local_5e8 + 8;
        local_5a0 = local_5a0 + 2;
      }
      for (; local_62c < local_118; local_62c = local_62c + 1) {
        local_58c = (int)*local_5e8 * (int)*local_5a0 + local_58c;
        local_590 = (int)local_5e8[1] * (int)*local_5a0 + local_590;
        local_594 = (int)local_5e8[2] * (int)*local_5a0 + local_594;
        local_598 = (int)local_5e8[3] * (int)*local_5a0 + local_598;
        local_5e8 = local_5e8 + 4;
        local_5a0 = local_5a0 + 1;
      }
      *local_380 = (float)local_58c * local_368 + local_358;
      *local_3c8 = (float)local_590 * local_36c + local_35c;
      *local_410 = (float)local_594 * local_370 + local_360;
      *local_458 = (float)local_598 * local_374 + local_364;
      local_380 = local_380 + 1;
      local_3c8 = local_3c8 + 1;
      local_410 = local_410 + 1;
      local_458 = local_458 + 1;
    }
  }
  for (local_630 = local_34c; local_630 < local_38; local_630 = local_630 + 1) {
    Mat::channel(in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
    pfVar3 = Mat::operator_cast_to_float_(&local_678);
    Mat::~Mat((Mat *)0x15951a);
    if (local_48 == (float *)0x0) {
      local_87c = 0.0;
    }
    else {
      local_87c = local_48[local_630];
    }
    local_67c = local_87c;
    local_638 = pfVar3;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)local_630);
    local_680 = *pvVar2;
    for (local_684 = 0; local_684 + 3 < local_114; local_684 = local_684 + 4) {
      Mat::channel(in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
      pcVar1 = Mat::operator_cast_to_signed_char_(&local_6d0);
      Mat::~Mat((Mat *)0x1595f9);
      local_690 = pcVar1;
      Mat::channel(in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
      pcVar1 = Mat::operator_cast_to_signed_char_(&local_718);
      Mat::~Mat((Mat *)0x15965b);
      local_6d8 = pcVar1;
      memset(local_728,0,0x10);
      for (local_72c = 0; local_72c + 1 < local_118; local_72c = local_72c + 2) {
        for (local_730 = 0; local_730 < 4; local_730 = local_730 + 1) {
          local_728[local_730] =
               (int)*local_6d8 * (int)local_690[local_730 << 1] + local_728[local_730];
          local_728[local_730] =
               (int)local_6d8[1] * (int)local_690[local_730 * 2 + 1] + local_728[local_730];
        }
        local_6d8 = local_6d8 + 2;
        local_690 = local_690 + 8;
      }
      for (; local_72c < local_118; local_72c = local_72c + 1) {
        for (local_734 = 0; local_734 < 4; local_734 = local_734 + 1) {
          local_728[local_734] = (int)*local_6d8 * (int)local_690[local_734] + local_728[local_734];
        }
        local_6d8 = local_6d8 + 1;
        local_690 = local_690 + 4;
      }
      for (local_738 = 0; local_738 < 4; local_738 = local_738 + 1) {
        local_638[local_738] = (float)local_728[local_738] * local_680 + local_67c;
      }
      local_638 = local_638 + 4;
    }
    for (; _c = (int)((ulong)in_stack_fffffffffffff750 >> 0x20), local_684 < local_114;
        local_684 = local_684 + 1) {
      local_73c = 0;
      Mat::channel(in_stack_fffffffffffff758,_c);
      in_stack_fffffffffffff758 = &local_788;
      pcVar1 = Mat::operator_cast_to_signed_char_(in_stack_fffffffffffff758);
      Mat::~Mat((Mat *)0x159963);
      local_748 = pcVar1;
      Mat::channel(in_stack_fffffffffffff758,_c);
      in_stack_fffffffffffff750 = Mat::operator_cast_to_signed_char_(&local_7d0);
      Mat::~Mat((Mat *)0x1599c5);
      local_790 = in_stack_fffffffffffff750;
      for (local_7d4 = 0; local_7d4 < local_118; local_7d4 = local_7d4 + 1) {
        local_73c = (int)*local_790 * (int)*local_748 + local_73c;
        local_790 = local_790 + 1;
        local_748 = local_748 + 1;
      }
      *local_638 = (float)local_73c * local_680 + local_67c;
      local_638 = local_638 + 1;
    }
  }
  Mat::~Mat((Mat *)0x159ac5);
  Mat::~Mat((Mat *)0x159ad2);
  Mat::~Mat((Mat *)0x159adf);
  return;
}

Assistant:

static void conv_im2col_sgemm_int8_dequant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, \
            const int kernel_w, const int kernel_h, const int stride_w, const int stride_h, const Mat &_bias, std::vector<float> scale_dequant, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char *kernel = _kernel;
    const float* bias = _bias;

    // im2row
    Mat bottom_im2row(kernel_h*kernel_w*inch, outw*outh, 1UL, opt.workspace_allocator);
    {
        signed char* ret = (signed char*)bottom_im2row;
        int retID = 0;
    
        for (int i=0; i<outh; i++)
        {
            for (int j=0; j<outw; j++)
            {
                for (int p=0; p<inch; p++)
                {
                    const signed char* input = bottom_blob.channel(p);
                    for (int u=0; u<kernel_h; u++)
                    {
                        for (int v=0; v<kernel_w; v++)
                        {    
                            int row = u + i * stride_h;
                            int col = v + j * stride_w;
                            int index = row * w + col;
                            ret[retID] = input[index];
                            retID++;
                        }
                    }                
                }
            }
        }
    }    

    int kernel_size = kernel_w * kernel_h;
    int out_size = outw * outh;

    // int M = outch;  // outch
    int N = outw * outh; // outsize or out stride
    int K = kernel_w * kernel_h * inch; // ksize * inch

    // bottom_im2row memory packed 4 x 4
    Mat bottom_tm(4*kernel_size, inch, out_size/4 + out_size%4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_size = out_size >> 2;
        int remain_size_start = nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii=0; ii<nn_size; ii++)
        {
            int i = ii * 4;

            const signed char* img0 = bottom_im2row.row<signed char>(i);
            const signed char* img1 = bottom_im2row.row<signed char>(i+1);
            const signed char* img2 = bottom_im2row.row<signed char>(i+2);
            const signed char* img3 = bottom_im2row.row<signed char>(i+3);

            signed char* tmpptr = bottom_tm.channel(i/4);

            int q = 0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];
                tmpptr[2] = img1[0];
                tmpptr[3] = img1[1];
                tmpptr[4] = img2[0];
                tmpptr[5] = img2[1];
                tmpptr[6] = img3[0];
                tmpptr[7] = img3[1];

                tmpptr += 8;
                img0 += 2;
                img1 += 2;
                img2 += 2;
                img3 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img1[0];
                tmpptr[2] = img2[0];
                tmpptr[3] = img3[0];

                tmpptr += 4;
                img0 += 1;
                img1 += 1;
                img2 += 1;
                img3 += 1;                
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_size_start; i<out_size; i++)
        {
            const signed char* img0 = bottom_im2row.row<signed char>(i);

            signed char* tmpptr = bottom_tm.channel(i/4 + i%4);

            int q=0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];

                tmpptr += 2;
                img0 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];

                tmpptr += 1;
                img0 += 1;
            }
        }       
    }

    // kernel memory packed 4 x 4
    Mat kernel_tm(4*kernel_size, inch, outch/4 + outch%4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int p = pp * 4;

            const signed char* k0 = kernel + (p+0)*inch*kernel_size;
            const signed char* k1 = kernel + (p+1)*inch*kernel_size;
            const signed char* k2 = kernel + (p+2)*inch*kernel_size;
            const signed char* k3 = kernel + (p+3)*inch*kernel_size;

            signed char* ktmp = kernel_tm.channel(p/4);

            int q=0;
            for (; q+1<inch*kernel_size; q+=2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp[2] = k1[0];
                ktmp[3] = k1[1];
                ktmp[4] = k2[0];
                ktmp[5] = k2[1];
                ktmp[6] = k3[0];
                ktmp[7] = k3[1];

                ktmp += 8;

                k0 += 2;
                k1 += 2;
                k2 += 2;
                k3 += 2;
            }

            for (; q<inch*kernel_size; q++)
            { 
                ktmp[0] = k0[0];
                ktmp[1] = k1[0];
                ktmp[2] = k2[0];
                ktmp[3] = k3[0];
                ktmp += 4;

                k0 += 1;
                k1 += 1;
                k2 += 1;
                k3 += 1;
            }           
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=remain_outch_start; p<outch; p++)
        {
            const signed char* k0 = kernel + (p+0)*inch*kernel_size;

            signed char* ktmp = kernel_tm.channel(p/4 + p%4);

            int q=0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp += 2;
                k0 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                ktmp[0] = k0[0];
                ktmp++;
                k0++;
            }
        }
    }    

    // 4x4
    // sgemm(int M, int N, int K, float* A, float* B, float* C)
    {
        // int M = outch;  // outch
        // int N = outw * outh; // outsize or out stride
        // int L = kernel_w * kernel_h * inch; // ksize * inch

        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int i = pp * 4;

            const float bias0 = bias ? bias[i] : 0.f;
            const float bias1 = bias ? bias[i+1] : 0.f;
            const float bias2 = bias ? bias[i+2] : 0.f;
            const float bias3 = bias ? bias[i+3] : 0.f;

            const float scale_dequant0 = scale_dequant[i];
            const float scale_dequant1 = scale_dequant[i+1];
            const float scale_dequant2 = scale_dequant[i+2];
            const float scale_dequant3 = scale_dequant[i+3];

            float* output0 = top_blob.channel(i);
            float* output1 = top_blob.channel(i+1);
            float* output2 = top_blob.channel(i+2);
            float* output3 = top_blob.channel(i+3);

            int j=0;
            for (; j+3<N; j=j+4)
            {
                signed char* vb = bottom_tm.channel(j/4);
                signed char* va = kernel_tm.channel(i/4);
                
                int sum0[4] = {0};
                int sum1[4] = {0};
                int sum2[4] = {0};
                int sum3[4] = {0};
               
                int k=0;

                for (; k+1<K; k=k+2)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[2*n];   // k0
                        sum0[n] += (int)va[1] * vb[2*n+1];

                        sum1[n] += (int)va[2] * vb[2*n];   // k1
                        sum1[n] += (int)va[3] * vb[2*n+1];

                        sum2[n] += (int)va[4] * vb[2*n];   // k2
                        sum2[n] += (int)va[5] * vb[2*n+1];

                        sum3[n] += (int)va[6] * vb[2*n];   // k3
                        sum3[n] += (int)va[7] * vb[2*n+1];
                    }

                    va += 8;
                    vb += 8;
                }

                for (; k<K; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[n];
                        sum1[n] += (int)va[1] * vb[n];
                        sum2[n] += (int)va[2] * vb[n];
                        sum3[n] += (int)va[3] * vb[n];
                    }
                    
                    va += 4;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output0[n] = (float)sum0[n] * scale_dequant0 + bias0;
                    output1[n] = (float)sum1[n] * scale_dequant1 + bias1;
                    output2[n] = (float)sum2[n] * scale_dequant2 + bias2;
                    output3[n] = (float)sum3[n] * scale_dequant3 + bias3;
                }
                output0 += 4;
                output1 += 4;
                output2 += 4;
                output3 += 4;
            }

            for (; j<N; j++)
            {                
                int sum0 = 0;
                int sum1 = 0;
                int sum2 = 0;
                int sum3 = 0;

                signed char* vb = bottom_tm.channel(j/4 + j%4);
                signed char* va = kernel_tm.channel(i/4);

                int k=0;

                for (; k+1<K; k=k+2)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum0 += (int)va[1] * vb[1];

                    sum1 += (int)va[2] * vb[0];
                    sum1 += (int)va[3] * vb[1];

                    sum2 += (int)va[4] * vb[0];
                    sum2 += (int)va[5] * vb[1];

                    sum3 += (int)va[6] * vb[0];
                    sum3 += (int)va[7] * vb[1];

                    va += 8;
                    vb += 2;
                }

                for (; k<K; k++)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum1 += (int)va[1] * vb[0];
                    sum2 += (int)va[2] * vb[0];
                    sum3 += (int)va[3] * vb[0];

                    va += 4;
                    vb += 1;
                }
                
                output0[0] = (float)sum0 * scale_dequant0 + bias0;
                output1[0] = (float)sum1 * scale_dequant1 + bias1;
                output2[0] = (float)sum2 * scale_dequant2 + bias2;
                output3[0] = (float)sum3 * scale_dequant3 + bias3;

                output0++;
                output1++;
                output2++;
                output3++;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_outch_start; i<outch; i++)
        {
            float* output = top_blob.channel(i);

            const float bias0 = bias ? bias[i] : 0.f;
            const float scale_dequant0 = scale_dequant[i];            

            int j=0;
            for (; j+3<N; j=j+4)
            {
                signed char* vb = bottom_tm.channel(j/4);
                signed char* va = kernel_tm.channel(i/4 + i%4);
                int sum[4] = {0};

                int k=0;
                for (; k+1<K; k=k+2)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += (int)va[0] * vb[2*n];
                        sum[n] += (int)va[1] * vb[2*n+1];
                    }
                    va += 2;
                    vb += 8;
                }

                for (; k<K; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += (int)va[0] * vb[n];
                    }
                    va += 1;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output[n] = (float)sum[n] * scale_dequant0 + bias0;
                }
                output += 4;
            }

            for (; j<N; j++)
            {
                int sum = 0;

                signed char* vb = bottom_tm.channel(j/4 + j%4);
                signed char* va = kernel_tm.channel(i/4 + i%4);

                for (int k=0; k<K; k++)
                {
                    sum += (int)va[0] * vb[0];

                    va += 1;
                    vb += 1;
                }
                output[0] = (float)sum * scale_dequant0 + bias0;

                output++;
            }
        }
    }

    // // sgemm(int M, int N, int K, float* A, float* B, float* C)
    // {
    //     for (int i=0; i<M; i++)
    //     {
    //         int* output = top_blob.channel(i);

    //         for (int j=0; j<N; j++)
    //         {
    //             int sum = 0;

    //             signed char* vb = (signed char*)bottom_im2row + K * j;
    //             const signed char* va = kernel + K * i;

    //             for (int k=0; k<K; k++)
    //             {
    //                 sum += (int)va[0] * vb[0];

    //                 va += 1;
    //                 vb += 1;
    //             }
    //             output[0] = sum;

    //             output++;
    //         }
    //     }
    // }
}